

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool appendToFile(string *filePath,string *text)

{
  uint uVar1;
  long local_220;
  ofstream file;
  uint auStack_200 [54];
  ios_base local_128 [264];
  
  std::ofstream::ofstream((string *)&local_220);
  std::ofstream::open((string *)&local_220,(_Ios_Openmode)filePath);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220 + -0x18));
  if ((uVar1 & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(text->_M_dataplus)._M_p,text->_M_string_length);
    std::ofstream::close();
  }
  local_220 = _VTT;
  *(undefined8 *)((long)&local_220 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&file);
  std::ios_base::~ios_base(local_128);
  return (uVar1 & 5) == 0;
}

Assistant:

bool appendToFile(const std::string filePath, const std::string text)
{
    std::ofstream file;
    file.open(filePath, std::ios::out | std::ios::app);
    if (file.fail())
        return false;

    file << text;
    file.close();
    return true;
}